

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_exts.c
# Opt level: O3

LY_ERR lyplg_ext_parse_extension_instance(lysp_ctx *pctx,lysp_ext_instance *ext)

{
  char *pcVar1;
  LY_ERR LVar2;
  lysp_stmt *plVar3;
  void **ppvVar4;
  lysp_ext_substmt *plVar5;
  void **ppvVar6;
  ly_ctx *ctx;
  char *pcVar7;
  
  plVar3 = ext->child;
  do {
    if (plVar3 == (lysp_stmt *)0x0) {
      ppvVar6 = (void **)0x0;
      while( true ) {
        if (ext->substmts == (lysp_ext_substmt *)0x0) {
          ppvVar4 = (void **)0x0;
        }
        else {
          ppvVar4 = ext->substmts[-1].storage_p;
        }
        if (ppvVar4 <= ppvVar6) break;
        for (plVar3 = ext->child; plVar3 != (lysp_stmt *)0x0; plVar3 = plVar3->next) {
          if ((ext->substmts[(long)ppvVar6].stmt == plVar3->kw) &&
             (LVar2 = lys_parser_ext_instance_stmt(pctx,ext->substmts + (long)ppvVar6,plVar3),
             LVar2 != LY_SUCCESS)) {
            return LVar2;
          }
        }
        ppvVar6 = (void **)((long)ppvVar6 + 1);
      }
      return LY_SUCCESS;
    }
    if ((plVar3->flags & 0xc00) == 0) {
      plVar5 = ext->substmts;
      if ((plVar5 == (lysp_ext_substmt *)0x0) ||
         (ppvVar6 = plVar5[-1].storage_p, ppvVar6 == (void **)0x0)) {
LAB_0019c0b3:
        if (pctx == (lysp_ctx *)0x0) {
          ctx = (ly_ctx *)0x0;
        }
        else {
          ctx = (ly_ctx *)
                **(undefined8 **)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
        }
        pcVar7 = ext->argument;
        pcVar1 = ", ";
        if (pcVar7 == (char *)0x0) {
          pcVar1 = "\t";
          pcVar7 = "";
        }
        ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid keyword \"%s\" as a child of \"%s%s%s\" extension instance.",plVar3->stmt,
                ext->name,pcVar1 + 1,pcVar7);
        return LY_EVALID;
      }
      while (plVar5->stmt != plVar3->kw) {
        plVar5 = plVar5 + 1;
        ppvVar6 = (void **)((long)ppvVar6 + -1);
        if (ppvVar6 == (void **)0x0) goto LAB_0019c0b3;
      }
      if (ppvVar6 == (void **)0x0) goto LAB_0019c0b3;
    }
    plVar3 = plVar3->next;
  } while( true );
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_ext_parse_extension_instance(struct lysp_ctx *pctx, struct lysp_ext_instance *ext)
{
    LY_ERR rc = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u;
    struct lysp_stmt *stmt;

    /* check for invalid substatements */
    LY_LIST_FOR(ext->child, stmt) {
        if (stmt->flags & (LYS_YIN_ATTR | LYS_YIN_ARGUMENT)) {
            continue;
        }
        LY_ARRAY_FOR(ext->substmts, u) {
            if (ext->substmts[u].stmt == stmt->kw) {
                break;
            }
        }
        if (u == LY_ARRAY_COUNT(ext->substmts)) {
            LOGVAL(PARSER_CTX(pctx), LYVE_SYNTAX_YANG, "Invalid keyword \"%s\" as a child of \"%s%s%s\" extension instance.",
                    stmt->stmt, ext->name, ext->argument ? " " : "", ext->argument ? ext->argument : "");
            rc = LY_EVALID;
            goto cleanup;
        }
    }

    /* parse all the known statements */
    LY_ARRAY_FOR(ext->substmts, u) {
        LY_LIST_FOR(ext->child, stmt) {
            if (ext->substmts[u].stmt != stmt->kw) {
                continue;
            }

            if ((rc = lys_parser_ext_instance_stmt(pctx, &ext->substmts[u], stmt))) {
                goto cleanup;
            }
        }
    }

cleanup:
    return rc;
}